

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O0

int fd_send(int sock,int *fds,size_t nfds)

{
  int *piVar1;
  int local_2c;
  uint local_28;
  int ret;
  uint step;
  uint i;
  size_t nfds_local;
  int *fds_local;
  int sock_local;
  
  if ((nfds == 0) || (fds == (int *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    fds_local._4_4_ = -1;
  }
  else {
    local_2c = 0;
    for (ret = 0; (uint)ret < nfds; ret = local_28 + ret) {
      if (nfds - (uint)ret < 0x5e9) {
        local_28 = (int)nfds - ret;
      }
      else {
        local_28 = 0x5e8;
      }
      local_2c = fd_package_send(sock,fds + (uint)ret,(ulong)local_28);
      if (local_2c != 0) break;
    }
    fds_local._4_4_ = local_2c;
  }
  return fds_local._4_4_;
}

Assistant:

int
fd_send(int sock, const int *fds, size_t nfds)
{
	unsigned int i, step;
	int ret;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_send(sock, fds + i, step);
		if (ret != 0)
			break;
		i += step;
	}

	return (ret);
}